

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.cc
# Opt level: O0

bool google::protobuf::internal::ParseAnyTypeUrl(string *type_url,string *full_type_name)

{
  long lVar1;
  long lVar2;
  string local_48 [32];
  long local_28;
  size_t pos;
  string *full_type_name_local;
  string *type_url_local;
  
  pos = (size_t)full_type_name;
  full_type_name_local = type_url;
  local_28 = std::__cxx11::string::find_last_of((char *)type_url,0xbc726d);
  if ((local_28 != -1) &&
     (lVar1 = local_28 + 1, lVar2 = std::__cxx11::string::size(), lVar1 != lVar2)) {
    std::__cxx11::string::substr((ulong)local_48,(ulong)full_type_name_local);
    std::__cxx11::string::operator=((string *)pos,local_48);
    std::__cxx11::string::~string(local_48);
    return true;
  }
  return false;
}

Assistant:

bool ParseAnyTypeUrl(const string& type_url, string* full_type_name) {
  size_t pos = type_url.find_last_of("/");
  if (pos == string::npos || pos + 1 == type_url.size()) {
    return false;
  }
  *full_type_name = type_url.substr(pos + 1);
  return true;
}